

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O2

void __thiscall QXcbEglIntegration::QXcbEglIntegration(QXcbEglIntegration *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QDebug local_18 [8];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QXcbGlIntegration::QXcbGlIntegration(&this->super_QXcbGlIntegration);
  *(undefined ***)this = &PTR__QXcbEglIntegration_0010d150;
  *(undefined ***)&this->super_QEGLIntegration = &PTR__QXcbEglIntegration_0010d1b8;
  (this->m_native_interface_handler).d = (QXcbEglNativeInterfaceHandler *)0x0;
  this->m_connection = (QXcbConnection *)0x0;
  this->m_egl_display = (EGLDisplay)0x0;
  this->m_using_platform_display = false;
  lVar1 = QtPrivateLogging::lcQpaGl();
  if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
    QMessageLogger::debug();
    QDebug::operator<<(local_18,"Xcb EGL gl-integration created");
    QDebug::~QDebug(local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXcbEglIntegration::QXcbEglIntegration()
    : m_connection(nullptr)
    , m_egl_display(EGL_NO_DISPLAY)
    , m_using_platform_display(false)
{
    qCDebug(lcQpaGl) << "Xcb EGL gl-integration created";
}